

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall
ON_3dmAnnotationSettings::EnableUseDimensionLayer
          (ON_3dmAnnotationSettings *this,bool use_dimension_layer)

{
  bool bVar1;
  ON_3dmAnnotationSettingsPrivate *this_00;
  bool use_dimension_layer_local;
  ON_3dmAnnotationSettings *this_local;
  
  if ((this != &Default) && (bVar1 = UseDimensionLayer(this), bVar1 != use_dimension_layer)) {
    if (this->m_private == (ON_3dmAnnotationSettingsPrivate *)0x0) {
      this_00 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
      memset(this_00,0,0x1c);
      ON_3dmAnnotationSettingsPrivate::ON_3dmAnnotationSettingsPrivate(this_00);
      this->m_private = this_00;
    }
    this->m_private->m_use_dimension_layer = use_dimension_layer;
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::EnableUseDimensionLayer(bool use_dimension_layer)
{
  if (this == &ON_3dmAnnotationSettings::Default)
    return;
  if (UseDimensionLayer() != use_dimension_layer)
  {
    if (nullptr == m_private)
      m_private = new ON_3dmAnnotationSettingsPrivate();
    m_private->m_use_dimension_layer = use_dimension_layer;
  }
}